

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

_Bool unshield_read_common_header(uint8_t **buffer,CommonHeader *common)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  
  puVar2 = (uint32_t *)*buffer;
  uVar1 = *puVar2;
  common->signature = uVar1;
  if (uVar1 == 0x28635349) {
    common->version = puVar2[1];
    common->volume_info = puVar2[2];
    common->cab_descriptor_offset = puVar2[3];
    common->cab_descriptor_size = puVar2[4];
    *buffer = (uint8_t *)(puVar2 + 5);
  }
  else {
    _unshield_log(1,"unshield_read_common_header",0xa6,"Invalid file signature");
    if (common->signature == 0x4643534d) {
      _unshield_log(2,"unshield_read_common_header",0xa9,
                    "Found Microsoft Cabinet header. Use cabextract (https://www.cabextract.org.uk/) to unpack this file."
                   );
    }
  }
  return uVar1 == 0x28635349;
}

Assistant:

bool unshield_read_common_header(uint8_t** buffer, CommonHeader* common)
{
  uint8_t* p = *buffer;
  common->signature              = READ_UINT32(p); p += 4;

  if (CAB_SIGNATURE != common->signature)
  {
    unshield_error("Invalid file signature");

    if (MSCF_SIGNATURE == common->signature)
      unshield_warning("Found Microsoft Cabinet header. Use cabextract (https://www.cabextract.org.uk/) to unpack this file.");

    return false;
  }

  common->version                = READ_UINT32(p); p += 4;
  common->volume_info            = READ_UINT32(p); p += 4;
  common->cab_descriptor_offset  = READ_UINT32(p); p += 4;
  common->cab_descriptor_size    = READ_UINT32(p); p += 4;

#if VERBOSE
  unshield_trace("Common header: %08x %08x %08x %08x",
      common->version, 
      common->volume_info, 
      common->cab_descriptor_offset, 
      common->cab_descriptor_size);
#endif

  *buffer = p;
  return true;
}